

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::Trainer::rescale_and_reset_weight_decay(Trainer *this)

{
  bool bVar1;
  uint uVar2;
  L2WeightDecay *this_00;
  reference ppPVar3;
  reference ppLVar4;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *in_RDI;
  LookupParameterStorage *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *__range1_1;
  ParameterStorage *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *__range1;
  float weight_decay;
  LookupParameterStorage *in_stack_ffffffffffffffb0;
  __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
  local_40;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *local_38;
  ParameterStorage *local_30;
  ParameterStorage **local_28;
  __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
  local_20;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *local_18;
  float local_c;
  
  this_00 = ParameterCollection::get_weight_decay((ParameterCollection *)0xdb10cb);
  local_c = L2WeightDecay::current_weight_decay(this_00);
  local_18 = ParameterCollection::parameters_list((ParameterCollection *)0xdb10e6);
  local_20._M_current =
       (ParameterStorage **)
       std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::begin
                 ((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *)
                  in_RDI);
  local_28 = (ParameterStorage **)
             std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::end
                       ((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                             *)in_RDI), bVar1) {
    ppPVar3 = __gnu_cxx::
              __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
              ::operator*(&local_20);
    local_30 = *ppPVar3;
    uVar2 = (*(local_30->super_ParameterStorageBase)._vptr_ParameterStorageBase[5])();
    if ((uVar2 & 1) != 0) {
      (**(local_30->super_ParameterStorageBase)._vptr_ParameterStorageBase)(local_c);
    }
    __gnu_cxx::
    __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
    ::operator++(&local_20);
  }
  local_38 = ParameterCollection::lookup_parameters_list((ParameterCollection *)0xdb116c);
  local_40._M_current =
       (LookupParameterStorage **)
       std::
       vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>::
       begin(in_RDI);
  std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>::
  end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                             *)in_RDI), bVar1) {
    ppLVar4 = __gnu_cxx::
              __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffffb0 = *ppLVar4;
    uVar2 = (*(in_stack_ffffffffffffffb0->super_ParameterStorageBase)._vptr_ParameterStorageBase[5])
                      ();
    if ((uVar2 & 1) != 0) {
      (**(in_stack_ffffffffffffffb0->super_ParameterStorageBase)._vptr_ParameterStorageBase)
                (local_c);
    }
    __gnu_cxx::
    __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
    ::operator++(&local_40);
  }
  ParameterCollection::get_weight_decay((ParameterCollection *)0xdb11f2);
  L2WeightDecay::reset_weight_decay((L2WeightDecay *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void Trainer::rescale_and_reset_weight_decay() {
  const float weight_decay = model->get_weight_decay().current_weight_decay();
  for (auto p : model->parameters_list())
    if (p->is_updated())
      p->scale_parameters(weight_decay);
  for (auto p : model->lookup_parameters_list())
    if (p->is_updated())
      p->scale_parameters(weight_decay);
  model->get_weight_decay().reset_weight_decay();
}